

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall GlobOpt::AreFromSameBytecodeFunc(GlobOpt *this,RegOpnd *src1,RegOpnd *dst)

{
  code *pcVar1;
  bool bVar2;
  StackSym *pSVar3;
  undefined4 *puVar4;
  StackSym *pSVar5;
  Func *pFVar6;
  Func *pFVar7;
  
  pSVar3 = SymTable::FindStackSym(this->func->m_symTable,(src1->m_sym->super_Sym).m_id);
  if (pSVar3 != src1->m_sym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x568,
                       "(this->func->m_symTable->FindStackSym(src1->m_sym->m_id) == src1->m_sym)",
                       "this->func->m_symTable->FindStackSym(src1->m_sym->m_id) == src1->m_sym");
    if (!bVar2) goto LAB_00441eea;
    *puVar4 = 0;
  }
  pSVar5 = SymTable::FindStackSym(this->func->m_symTable,(dst->m_sym->super_Sym).m_id);
  pSVar3 = dst->m_sym;
  if (pSVar5 != pSVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x569,
                       "(this->func->m_symTable->FindStackSym(dst->m_sym->m_id) == dst->m_sym)",
                       "this->func->m_symTable->FindStackSym(dst->m_sym->m_id) == dst->m_sym");
    if (!bVar2) {
LAB_00441eea:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    pSVar3 = dst->m_sym;
  }
  if (((pSVar3->field_0x19 & 0x20) == 0) || ((src1->m_sym->field_0x19 & 0x20) == 0)) {
    bVar2 = false;
  }
  else {
    pFVar6 = StackSym::GetByteCodeFunc(src1->m_sym);
    pFVar7 = StackSym::GetByteCodeFunc(dst->m_sym);
    bVar2 = pFVar6 == pFVar7;
  }
  return bVar2;
}

Assistant:

bool
GlobOpt::AreFromSameBytecodeFunc(IR::RegOpnd const* src1, IR::RegOpnd const* dst) const
{
    Assert(this->func->m_symTable->FindStackSym(src1->m_sym->m_id) == src1->m_sym);
    Assert(this->func->m_symTable->FindStackSym(dst->m_sym->m_id) == dst->m_sym);
    if (dst->m_sym->HasByteCodeRegSlot() && src1->m_sym->HasByteCodeRegSlot())
    {
        return src1->m_sym->GetByteCodeFunc() == dst->m_sym->GetByteCodeFunc();
    }
    return false;
}